

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

void vkt::ubo::anon_unknown_0::generateDeclaration
               (ostringstream *src,int blockNdx,UniformBlock *block,UniformLayout *layout,
               bool shuffleUniformMembers)

{
  Uniform *uniform;
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  Indent local_80 [4];
  Uniform *local_70;
  Uniform *pUniform;
  __normal_iterator<const_vkt::ubo::Uniform_*,_std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>_>
  local_60;
  undefined1 local_58 [8];
  Traverser<const_vkt::ubo::Uniform> uniforms;
  bool shuffleUniformMembers_local;
  UniformLayout *layout_local;
  UniformBlock *block_local;
  int blockNdx_local;
  ostringstream *src_local;
  
  poVar4 = std::operator<<((ostream *)src,"layout(set = 0, binding = ");
  std::ostream::operator<<(poVar4,blockNdx);
  dVar2 = UniformBlock::getFlags(block);
  if ((dVar2 & 0x1f8) != 0) {
    poVar4 = std::operator<<((ostream *)src,", ");
    dVar2 = UniformBlock::getFlags(block);
    LayoutFlagsFmt::LayoutFlagsFmt
              ((LayoutFlagsFmt *)((long)&uniforms.m_next._M_current + 4),dVar2 & 0x1f8,0);
    operator<<(poVar4,(LayoutFlagsFmt *)((long)&uniforms.m_next._M_current + 4));
  }
  std::operator<<((ostream *)src,") ");
  poVar4 = std::operator<<((ostream *)src,"uniform ");
  psVar5 = UniformBlock::getBlockName_abi_cxx11_(block);
  std::operator<<(poVar4,(string *)psVar5);
  std::operator<<((ostream *)src,"\n{\n");
  local_60._M_current = (Uniform *)UniformBlock::begin(block);
  pUniform = (Uniform *)UniformBlock::end(block);
  ubo::(anonymous_namespace)::Traverser<vkt::ubo::Uniform_const>::
  Traverser<__gnu_cxx::__normal_iterator<vkt::ubo::Uniform_const*,std::vector<vkt::ubo::Uniform,std::allocator<vkt::ubo::Uniform>>>>
            ((Traverser<vkt::ubo::Uniform_const> *)local_58,local_60,
             (__normal_iterator<const_vkt::ubo::Uniform_*,_std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>_>
              )pUniform,shuffleUniformMembers);
  while (local_70 = Traverser<const_vkt::ubo::Uniform>::next
                              ((Traverser<const_vkt::ubo::Uniform> *)local_58),
        local_70 != (Uniform *)0x0) {
    Indent::Indent(local_80,1);
    operator<<((ostream *)src,local_80);
    uniform = local_70;
    dVar2 = getBlockMemberOffset(blockNdx,block,local_70,layout);
    generateDeclaration(src,uniform,1,dVar2);
  }
  std::operator<<((ostream *)src,"}");
  bVar1 = UniformBlock::hasInstanceName(block);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)src," ");
    psVar5 = UniformBlock::getInstanceName_abi_cxx11_(block);
    std::operator<<(poVar4,(string *)psVar5);
    bVar1 = UniformBlock::isArray(block);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)src,"[");
      iVar3 = UniformBlock::getArraySize(block);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::operator<<(poVar4,"]");
    }
  }
  std::operator<<((ostream *)src,";\n");
  Traverser<const_vkt::ubo::Uniform>::~Traverser((Traverser<const_vkt::ubo::Uniform> *)local_58);
  return;
}

Assistant:

void generateDeclaration (std::ostringstream& src, int blockNdx, const UniformBlock& block, const UniformLayout& layout, bool shuffleUniformMembers)
{
	src << "layout(set = 0, binding = " << blockNdx;
	if ((block.getFlags() & LAYOUT_MASK) != 0)
		src << ", " << LayoutFlagsFmt(block.getFlags() & LAYOUT_MASK);
	src << ") ";

	src << "uniform " << block.getBlockName();
	src << "\n{\n";

	Traverser<const Uniform> uniforms(block.begin(), block.end(), shuffleUniformMembers);

	while (const Uniform* pUniform = uniforms.next())
	{
		src << Indent(1);
		generateDeclaration(src, *pUniform, 1 /* indent level */, getBlockMemberOffset(blockNdx, block, *pUniform, layout));
	}

	src << "}";

	if (block.hasInstanceName())
	{
		src << " " << block.getInstanceName();
		if (block.isArray())
			src << "[" << block.getArraySize() << "]";
	}
	else
		DE_ASSERT(!block.isArray());

	src << ";\n";
}